

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declared_entities.h
# Opt level: O3

void __thiscall Shogun::Shogun(Shogun *this)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Shogibear","");
  Entity::Entity(&this->super_Entity,&local_38,100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (this->super_Entity)._vptr_Entity = (_func_int **)&PTR_act_00113cf8;
  return;
}

Assistant:

Shogun() : Entity("Shogibear", 100) 
  {
    //nop
  }